

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O2

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  SubstituteArg **ppSVar1;
  char cVar2;
  byte bVar3;
  size_type sVar4;
  SubstituteArg *pSVar5;
  string *psVar6;
  LogMessage *pLVar7;
  int iVar8;
  pointer pcVar9;
  long lVar10;
  uint value;
  int iVar11;
  char *__dest;
  SubstituteArg *args_array [11];
  LogMessage local_b8;
  string local_80;
  string *local_60;
  string local_58;
  allocator local_32;
  LogFinisher local_31;
  
  args_array[0] = arg1;
  args_array[1] = arg2;
  args_array[2] = arg3;
  args_array[3] = arg4;
  args_array[4] = arg5;
  args_array[5] = arg6;
  args_array[6] = arg7;
  args_array[7] = arg8;
  args_array[8] = arg9;
  args_array[9] = (SubstituteArg *)0x0;
  local_60 = output;
  iVar8 = 0;
  iVar11 = 0;
  do {
    cVar2 = format[iVar8];
    if (cVar2 == '\0') goto LAB_0030ffc7;
    if (cVar2 == '$') {
      bVar3 = format[(long)iVar8 + 1];
      iVar8 = iVar8 + 1;
      if (9 < (byte)(bVar3 - 0x30)) {
        if (bVar3 == 0x24) goto LAB_0030fe5a;
        protobuf::internal::LogMessage::LogMessage
                  (&local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/substitute.cc"
                   ,99);
        pLVar7 = protobuf::internal::LogMessage::operator<<
                           (&local_b8,"Invalid strings::Substitute() format string: \"");
        std::__cxx11::string::string((string *)&local_80,format,&local_32);
        CEscape(&local_58,&local_80);
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,&local_58);
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"\".");
        protobuf::internal::LogFinisher::operator=(&local_31,pLVar7);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_80);
        goto LAB_003100b3;
      }
      value = bVar3 - 0x30;
      if (args_array[(ulong)value - 1]->size_ == -1) {
        protobuf::internal::LogMessage::LogMessage
                  (&local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/substitute.cc"
                   ,0x56);
        pLVar7 = protobuf::internal::LogMessage::operator<<
                           (&local_b8,"strings::Substitute format string invalid: asked for \"$");
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,value);
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"\", but only ");
        lVar10 = 0;
        while ((arg0 != (SubstituteArg *)0x0 && (arg0->size_ != -1))) {
          ppSVar1 = args_array + lVar10;
          lVar10 = lVar10 + 1;
          arg0 = *ppSVar1;
        }
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,(int)lVar10);
        pLVar7 = protobuf::internal::LogMessage::operator<<
                           (pLVar7," args were given.  Full format string was: \"");
        std::__cxx11::string::string((string *)&local_80,format,&local_32);
        CEscape(&local_58,&local_80);
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,&local_58);
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"\".");
        protobuf::internal::LogFinisher::operator=(&local_31,pLVar7);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_80);
        protobuf::internal::LogMessage::~LogMessage(&local_b8);
LAB_0030ffc7:
        psVar6 = local_60;
        if (cVar2 != '\0') {
          return;
        }
        if (iVar11 == 0) {
          return;
        }
        sVar4 = local_60->_M_string_length;
        std::__cxx11::string::resize((ulong)local_60);
        iVar8 = 0;
        if (psVar6->_M_string_length == 0) {
          pcVar9 = (pointer)0x0;
        }
        else {
          pcVar9 = (psVar6->_M_dataplus)._M_p;
        }
        __dest = pcVar9 + (int)sVar4;
        do {
          cVar2 = format[iVar8];
          if (cVar2 == '$') {
            bVar3 = format[(long)iVar8 + 1];
            if ((byte)(bVar3 - 0x30) < 10) {
              pSVar5 = args_array[(ulong)(bVar3 & 0xf) - 1];
              memcpy(__dest,pSVar5->text_,(long)pSVar5->size_);
              __dest = __dest + pSVar5->size_;
              iVar8 = iVar8 + 1;
            }
            else if (bVar3 == 0x24) {
              *__dest = '$';
              __dest = __dest + 1;
              iVar8 = iVar8 + 1;
            }
          }
          else {
            if (cVar2 == '\0') {
              if ((long)__dest - (long)(psVar6->_M_dataplus)._M_p == psVar6->_M_string_length) {
                return;
              }
              protobuf::internal::LogMessage::LogMessage
                        (&local_b8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/substitute.cc"
                         ,0x85);
              pLVar7 = protobuf::internal::LogMessage::operator<<
                                 (&local_b8,
                                  "CHECK failed: (target - output->data()) == (output->size()): ");
              protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar7);
LAB_003100b3:
              protobuf::internal::LogMessage::~LogMessage(&local_b8);
              return;
            }
            *__dest = cVar2;
            __dest = __dest + 1;
          }
          iVar8 = iVar8 + 1;
        } while( true );
      }
      iVar11 = iVar11 + args_array[(ulong)value - 1]->size_;
    }
    else {
LAB_0030fe5a:
      iVar11 = iVar11 + 1;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, nullptr
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        unsigned int index = format[i+1] - '0';
        assert(index < 10);
        const SubstituteArg* src = args_array[index];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}